

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

void av1_cnn_batchnorm_c(float **image,int channels,int width,int height,int stride,float *gamma,
                        float *beta,float *mean,float *std)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  ulong uVar6;
  int row;
  int iVar7;
  ulong uVar8;
  float *pfVar9;
  int col;
  ulong uVar10;
  
  uVar6 = 0;
  uVar5 = (ulong)(uint)width;
  if (width < 1) {
    uVar5 = uVar6;
  }
  if (height < 1) {
    height = 0;
  }
  uVar8 = (ulong)(uint)channels;
  if (channels < 1) {
    uVar8 = uVar6;
  }
  for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
    fVar1 = gamma[uVar6];
    fVar2 = beta[uVar6];
    fVar3 = mean[uVar6];
    fVar4 = std[uVar6];
    pfVar9 = image[uVar6];
    for (iVar7 = 0; iVar7 != height; iVar7 = iVar7 + 1) {
      for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
        pfVar9[uVar10] = ((pfVar9[uVar10] - fVar3) * fVar1) / fVar4 + fVar2;
      }
      pfVar9 = pfVar9 + stride;
    }
  }
  return;
}

Assistant:

void av1_cnn_batchnorm_c(float **image, int channels, int width, int height,
                         int stride, const float *gamma, const float *beta,
                         const float *mean, const float *std) {
  assert(gamma && beta && beta && std && "batchnorm has null parameter!");
  for (int ch = 0; ch < channels; ch++) {
    const float ch_gamma = gamma[ch];
    const float ch_beta = beta[ch];
    const float ch_mean = mean[ch];
    const float ch_std = std[ch];
    float *image_row = image[ch];

    for (int row = 0; row < height; row++) {
      for (int col = 0; col < width; col++) {
        image_row[col] =
            ch_gamma * (image_row[col] - ch_mean) / ch_std + ch_beta;
      }
      image_row += stride;
    }
  }
}